

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseValue<google::protobuf::json_internal::ParseProto3Type>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
          Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  undefined8 uVar1;
  bool bVar2;
  Type TVar3;
  Status *pSVar4;
  Kind *pKVar5;
  Field pFVar6;
  MessagePath *pMVar7;
  LocationWith<double> *pLVar8;
  LocationWith<google::protobuf::json_internal::MaybeOwnedString> *this_00;
  string *this_01;
  char *pcVar9;
  char cVar10;
  string_view sVar11;
  string_view sVar12;
  undefined1 auVar13 [16];
  undefined1 local_2b8 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
  pop_5;
  Field field_5;
  undefined1 local_270 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
  pop_4;
  Field field_4;
  basic_string_view<char,_std::char_traits<char>_> local_248;
  byte local_233;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  byte local_219;
  string_view local_218;
  string_view local_208;
  undefined1 local_1f8 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
  pop_3;
  Field field_3;
  undefined1 local_1c0 [8];
  StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
  str;
  undefined1 local_148 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
  pop_2;
  Field field_2;
  undefined1 local_120 [8];
  StatusOr<google::protobuf::json_internal::LocationWith<double>_> number;
  undefined1 local_d0 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
  pop_1;
  Field field_1;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  byte local_91;
  string_view local_90;
  string_view local_80;
  undefined1 local_70 [8];
  Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
  pop;
  Field field;
  undefined1 local_38 [8];
  StatusOr<google::protobuf::json_internal::JsonLexer::Kind> kind;
  Msg<google::protobuf::json_internal::ParseProto3Type> *msg_local;
  Desc<google::protobuf::json_internal::ParseProto3Type> *desc_local;
  JsonLexer *lex_local;
  Status *_status;
  
  kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>._8_8_ = msg;
  JsonLexer::PeekKind((JsonLexer *)local_38);
  pSVar4 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::status
                     ((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)local_38);
  absl::lts_20240722::Status::Status((Status *)this,pSVar4);
  bVar2 = absl::lts_20240722::Status::ok((Status *)this);
  bVar2 = ((bVar2 ^ 0xffU) & 1) != 0;
  if (!bVar2) {
    absl::lts_20240722::Status::~Status((Status *)this);
  }
  if (bVar2) goto LAB_004bab2f;
  pKVar5 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::operator*
                     ((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)local_38);
  switch(*pKVar5) {
  case kObj:
    JsonLocation::SourceLocation::current();
    pFVar6 = Proto3Type::MustHaveField(desc,5);
    pMVar7 = JsonLexer::path(lex);
    sVar11 = Proto3Type::FieldName(pFVar6);
    TVar3 = Proto3Type::FieldType(pFVar6);
    sVar12 = Proto3Type::FieldTypeName(pFVar6);
    MessagePath::Push((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                       *)local_270,pMVar7,sVar11,TVar3,sVar12);
    ParseProto3Type::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&,auto:2&)_1_>
              ((ParseProto3Type *)this,pFVar6,
               (Msg *)kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>.
                      _8_8_,(anon_class_8_1_ba1d5d7f)lex);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/message_path.h:37:30)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                *)local_270);
    goto LAB_004bab2f;
  case kArr:
    JsonLocation::SourceLocation::current();
    pFVar6 = Proto3Type::MustHaveField(desc,6);
    pMVar7 = JsonLexer::path(lex);
    sVar11 = Proto3Type::FieldName(pFVar6);
    TVar3 = Proto3Type::FieldType(pFVar6);
    sVar12 = Proto3Type::FieldTypeName(pFVar6);
    MessagePath::Push((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                       *)local_2b8,pMVar7,sVar11,TVar3,sVar12);
    ParseProto3Type::
    NewMsg<google::protobuf::json_internal::(anonymous_namespace)::ParseValue<google::protobuf::json_internal::ParseProto3Type>(google::protobuf::json_internal::JsonLexer&,google::protobuf::json_internal::ParseProto3Type::Desc_const&,google::protobuf::json_internal::ParseProto3Type::Msg&)::_lambda(auto:1&,auto:2&)_2_>
              ((ParseProto3Type *)this,pFVar6,
               (Msg *)kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>.
                      _8_8_,(anon_class_8_1_ba1d5d7f)lex);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/message_path.h:37:30)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                *)local_2b8);
    goto LAB_004bab2f;
  case kStr:
    JsonLocation::SourceLocation::current();
    pFVar6 = Proto3Type::MustHaveField(desc,3);
    pMVar7 = JsonLexer::path(lex);
    sVar11 = Proto3Type::FieldName(pFVar6);
    TVar3 = Proto3Type::FieldType(pFVar6);
    sVar12 = Proto3Type::FieldTypeName(pFVar6);
    str.
    super_StatusOrData<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    .field_1.data_.loc.path = (MessagePath *)sVar12._M_len;
    pcVar9 = (char *)(ulong)TVar3;
    MessagePath::Push((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                       *)local_148,pMVar7,sVar11,TVar3,sVar12);
    JsonLexer::ParseUtf8
              ((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                *)local_1c0,lex);
    pSVar4 = absl::lts_20240722::
             StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
             ::status((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                       *)local_1c0);
    absl::lts_20240722::Status::Status((Status *)this,pSVar4);
    bVar2 = absl::lts_20240722::Status::ok((Status *)this);
    cVar10 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (!(bool)cVar10) {
      absl::lts_20240722::Status::~Status((Status *)this);
      uVar1 = kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>._8_8_;
      this_00 = absl::lts_20240722::
                StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                              *)local_1c0);
      this_01 = MaybeOwnedString::ToString_abi_cxx11_(&this_00->value);
      auVar13 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_01);
      sVar11._M_str = pcVar9;
      sVar11._M_len = auVar13._8_8_;
      ParseProto3Type::SetString((ParseProto3Type *)pFVar6,(Field)uVar1,auVar13._0_8_,sVar11);
      cVar10 = '\x04';
    }
    absl::lts_20240722::
    StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
    ::~StatusOr((StatusOr<google::protobuf::json_internal::LocationWith<google::protobuf::json_internal::MaybeOwnedString>_>
                 *)local_1c0);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/message_path.h:37:30)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                *)local_148);
    break;
  case kNum:
    JsonLocation::SourceLocation::current();
    pFVar6 = Proto3Type::MustHaveField(desc,2);
    pMVar7 = JsonLexer::path(lex);
    sVar11 = Proto3Type::FieldName(pFVar6);
    TVar3 = Proto3Type::FieldType(pFVar6);
    sVar12 = Proto3Type::FieldTypeName(pFVar6);
    number.super_StatusOrData<google::protobuf::json_internal::LocationWith<double>_>.field_1.data_.
    loc.path = (MessagePath *)sVar12._M_len;
    MessagePath::Push((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                       *)local_d0,pMVar7,sVar11,TVar3,sVar12);
    JsonLexer::ParseNumber
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)local_120,lex);
    pSVar4 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<double>_>::
             status((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)local_120);
    absl::lts_20240722::Status::Status((Status *)this,pSVar4);
    bVar2 = absl::lts_20240722::Status::ok((Status *)this);
    cVar10 = ((bVar2 ^ 0xffU) & 1) != 0;
    if (!(bool)cVar10) {
      absl::lts_20240722::Status::~Status((Status *)this);
      uVar1 = kind.super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>._8_8_;
      pLVar8 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<double>_>
               ::operator->((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)
                            local_120);
      ParseProto3Type::SetDouble(pFVar6,(Msg *)uVar1,pLVar8->value);
      cVar10 = '\x04';
    }
    absl::lts_20240722::StatusOr<google::protobuf::json_internal::LocationWith<double>_>::~StatusOr
              ((StatusOr<google::protobuf::json_internal::LocationWith<double>_> *)local_120);
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/message_path.h:37:30)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                *)local_d0);
    break;
  case kTrue:
  case kFalse:
    JsonLocation::SourceLocation::current();
    pFVar6 = Proto3Type::MustHaveField(desc,4);
    pMVar7 = JsonLexer::path(lex);
    local_208 = Proto3Type::FieldName(pFVar6);
    TVar3 = Proto3Type::FieldType(pFVar6);
    local_218 = Proto3Type::FieldTypeName(pFVar6);
    MessagePath::Push((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                       *)local_1f8,pMVar7,local_208,TVar3,local_218);
    pKVar5 = absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::
             operator*((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)local_38);
    if (*pKVar5 == kTrue) {
      local_219 = 0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_230,"true");
      JsonLocation::SourceLocation::current();
      JsonLexer::Expect((JsonLexer *)this,lex,local_230._M_len,local_230._M_str);
      bVar2 = absl::lts_20240722::Status::ok((Status *)this);
      cVar10 = ((bVar2 ^ 0xffU) & 1) != 0;
      if ((bool)cVar10) {
        local_219 = 1;
      }
      if ((local_219 & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      if (!(bool)cVar10) {
        ParseProto3Type::SetBool
                  (pFVar6,(Msg *)kind.
                                 super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>
                                 ._8_8_,true);
LAB_004ba825:
        cVar10 = '\x04';
      }
    }
    else {
      local_233 = 0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_248,"false");
      JsonLocation::SourceLocation::current();
      JsonLexer::Expect((JsonLexer *)this,lex,local_248._M_len,local_248._M_str);
      bVar2 = absl::lts_20240722::Status::ok((Status *)this);
      cVar10 = ((bVar2 ^ 0xffU) & 1) != 0;
      if ((bool)cVar10) {
        local_233 = 1;
      }
      if ((local_233 & 1) == 0) {
        absl::lts_20240722::Status::~Status((Status *)this);
      }
      if (!(bool)cVar10) {
        ParseProto3Type::SetBool
                  (pFVar6,(Msg *)kind.
                                 super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>
                                 ._8_8_,false);
        goto LAB_004ba825;
      }
    }
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/message_path.h:37:30)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                *)local_1f8);
    goto joined_r0x004b9fff;
  case kNull:
    JsonLocation::SourceLocation::current();
    pFVar6 = Proto3Type::MustHaveField(desc,1);
    pMVar7 = JsonLexer::path(lex);
    local_80 = Proto3Type::FieldName(pFVar6);
    TVar3 = Proto3Type::FieldType(pFVar6);
    local_90 = Proto3Type::FieldTypeName(pFVar6);
    MessagePath::Push((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                       *)local_70,pMVar7,local_80,TVar3,local_90);
    local_91 = 0;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,"null");
    JsonLocation::SourceLocation::current();
    JsonLexer::Expect((JsonLexer *)this,lex,local_a8._M_len,local_a8._M_str);
    bVar2 = absl::lts_20240722::Status::ok((Status *)this);
    cVar10 = ((bVar2 ^ 0xffU) & 1) != 0;
    if ((bool)cVar10) {
      local_91 = 1;
    }
    if ((local_91 & 1) == 0) {
      absl::lts_20240722::Status::~Status((Status *)this);
    }
    if (!(bool)cVar10) {
      ParseProto3Type::SetEnum
                (pFVar6,(Msg *)kind.
                               super_StatusOrData<google::protobuf::json_internal::JsonLexer::Kind>.
                               _8_8_,0);
      cVar10 = '\x04';
    }
    absl::lts_20240722::
    Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/json/internal/message_path.h:37:30)>
    ::~Cleanup((Cleanup<absl::lts_20240722::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_json_internal_message_path_h:37:30)>
                *)local_70);
joined_r0x004b9fff:
    if (cVar10 != '\x04') goto LAB_004bab2f;
  default:
    goto switchD_004b9e1f_default;
  }
  if (cVar10 == '\x04') {
switchD_004b9e1f_default:
    absl::lts_20240722::OkStatus();
  }
LAB_004bab2f:
  absl::lts_20240722::StatusOr<google::protobuf::json_internal::JsonLexer::Kind>::~StatusOr
            ((StatusOr<google::protobuf::json_internal::JsonLexer::Kind> *)local_38);
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseValue(JsonLexer& lex, const Desc<Traits>& desc,
                        Msg<Traits>& msg) {
  auto kind = lex.PeekKind();
  RETURN_IF_ERROR(kind.status());
  // NOTE: The field numbers 1 through 6 are the numbers of the oneof fields
  // in google.protobuf.Value. Conformance tests verify the correctness of
  // these numbers.
  switch (*kind) {
    case JsonLexer::kNull: {
      auto field = Traits::MustHaveField(desc, 1);
      auto pop =
          lex.path().Push(Traits::FieldName(field), Traits::FieldType(field),
                          Traits::FieldTypeName(field));

      RETURN_IF_ERROR(lex.Expect("null"));
      Traits::SetEnum(field, msg, 0);
      break;
    }
    case JsonLexer::kNum: {
      auto field = Traits::MustHaveField(desc, 2);
      auto pop =
          lex.path().Push(Traits::FieldName(field), Traits::FieldType(field),
                          Traits::FieldTypeName(field));

      auto number = lex.ParseNumber();
      RETURN_IF_ERROR(number.status());
      Traits::SetDouble(field, msg, number->value);
      break;
    }
    case JsonLexer::kStr: {
      auto field = Traits::MustHaveField(desc, 3);
      auto pop =
          lex.path().Push(Traits::FieldName(field), Traits::FieldType(field),
                          Traits::FieldTypeName(field));

      auto str = lex.ParseUtf8();
      RETURN_IF_ERROR(str.status());
      Traits::SetString(field, msg, std::move(str->value.ToString()));
      break;
    }
    case JsonLexer::kFalse:
    case JsonLexer::kTrue: {
      auto field = Traits::MustHaveField(desc, 4);
      auto pop =
          lex.path().Push(Traits::FieldName(field), Traits::FieldType(field),
                          Traits::FieldTypeName(field));

      // "Quoted" bools, including non-standard Abseil Atob bools, are not
      // supported, because all strings are treated as genuine JSON strings.
      if (*kind == JsonLexer::kTrue) {
        RETURN_IF_ERROR(lex.Expect("true"));
        Traits::SetBool(field, msg, true);
      } else {
        RETURN_IF_ERROR(lex.Expect("false"));
        Traits::SetBool(field, msg, false);
      }
      break;
    }
    case JsonLexer::kObj: {
      auto field = Traits::MustHaveField(desc, 5);
      auto pop =
          lex.path().Push(Traits::FieldName(field), Traits::FieldType(field),
                          Traits::FieldTypeName(field));

      return Traits::NewMsg(field, msg, [&](auto& desc, auto& msg) {
        return ParseStructValue<Traits>(lex, desc, msg);
      });
    }
    case JsonLexer::kArr: {
      auto field = Traits::MustHaveField(desc, 6);
      auto pop =
          lex.path().Push(Traits::FieldName(field), Traits::FieldType(field),
                          Traits::FieldTypeName(field));

      return Traits::NewMsg(field, msg, [&](auto& desc, auto& msg) {
        return ParseListValue<Traits>(lex, desc, msg);
      });
    }
  }

  return absl::OkStatus();
}